

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptProxy::HasPropertyQuery
          (JavascriptProxy *this,PropertyId propertyId,PropertyValueInfo *info)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  bool bVar3;
  BOOL BVar4;
  Attributes attributes;
  int iVar5;
  HostScriptContext *pHVar6;
  RecyclableObject *pRVar7;
  JavascriptFunction *function;
  undefined1 local_70 [48];
  RecyclableObject *local_40;
  PropertyId local_38;
  bool local_31;
  
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return Property_NotFound;
  }
  local_38 = propertyId;
  pHVar6 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar6->scriptContext;
  pRVar7 = MarshalHandler(this,pSVar2);
  if (pRVar7 == (RecyclableObject *)0x0) {
    bVar3 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar3) {
      return Property_NotFound;
    }
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"has");
  }
  local_40 = MarshalTarget(this,pSVar2);
  function = GetMethodHelper(this,0xb4,pSVar2);
  if ((function == (JavascriptFunction *)0x0) ||
     (bVar3 = ScriptContext::IsHeapEnumInProgress(pSVar2), bVar3)) {
    BVar4 = JavascriptOperators::HasProperty(local_40,local_38);
    return (uint)(BVar4 != 0);
  }
  local_70._32_8_ = GetName(pSVar2,local_38);
  local_70._24_8_ = local_40;
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_70._0_8_ = this_00;
  local_70._8_8_ = function;
  local_70._16_8_ = pRVar7;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar3 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar3) {
    pRVar7 = (RecyclableObject *)
             anon_func::anon_class_40_5_39f35981::operator()((anon_class_40_5_39f35981 *)local_70);
    bVar3 = ThreadContext::IsOnStack(pRVar7);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      pRVar7 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                 super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      goto LAB_00ba476d;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      pRVar7 = (RecyclableObject *)
               anon_func::anon_class_40_5_39f35981::operator()((anon_class_40_5_39f35981 *)local_70)
      ;
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ba476d;
    }
    pRVar7 = (RecyclableObject *)
             anon_func::anon_class_40_5_39f35981::operator()((anon_class_40_5_39f35981 *)local_70);
    bVar3 = ThreadContext::IsOnStack(pRVar7);
  }
  if (bVar3 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ba476d:
  this_00->reentrancySafeOrHandled = local_31;
  BVar4 = JavascriptConversion::ToBoolean(pRVar7,pSVar2);
  if (BVar4 != 0) {
    return Property_Found;
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_70);
  BVar4 = JavascriptOperators::GetOwnPropertyDescriptor
                    (local_40,local_38,pSVar2,(PropertyDescriptor *)local_70);
  if (BVar4 == 0) {
    return Property_NotFound;
  }
  bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_70);
  if ((bVar3) &&
     (iVar5 = (*(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x33])(), iVar5 != 0)) {
    return Property_NotFound;
  }
  JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"has");
}

Assistant:

PropertyQueryFlags JavascriptProxy::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (info)
        {
            // Prevent caching. See comment in GetPropertyQuery for more detail.
            PropertyValueInfo::SetNoCache(info, this);
            PropertyValueInfo::DisablePrototypeCache(info, this);
        }
        auto fn = [&](RecyclableObject* object)->BOOL {
            return JavascriptOperators::HasProperty(object, propertyId);
        };
        auto getPropertyId = [&]() ->PropertyId {
            return propertyId;
        };
        return JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyId));
    }